

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O1

LY_ERR lyd_diff_add(lyd_node *node,lyd_diff_op op,char *orig_default,char *orig_value,char *key,
                   char *value,char *position,char *orig_key,char *orig_position,lyd_node **diff)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  lysc_node *plVar4;
  lyd_node *node_00;
  lysc_node *plVar5;
  bool bVar6;
  lyd_diff_op lVar7;
  LY_ERR LVar8;
  uint32_t uVar9;
  int iVar10;
  LY_ERR LVar11;
  lyd_node *plVar12;
  char *pcVar13;
  lyd_node_inner *plVar14;
  lys_module *plVar15;
  lyd_node_inner *plVar16;
  lyd_node_inner *plVar17;
  ulong uVar18;
  lyd_diff_op cur_op;
  lyd_meta *meta;
  size_t bufused;
  size_t buflen;
  lyd_node_inner *local_90;
  lyd_node *local_88;
  lyd_diff_op local_7c;
  lyd_node_inner *local_78;
  lyd_diff_op local_6c;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  lyd_meta *local_48;
  size_t local_40;
  size_t local_38;
  
  local_78 = (lyd_node_inner *)0x0;
  if (diff == (lyd_node **)0x0) {
    __assert_fail("diff",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x141,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  plVar4 = node->schema;
  uVar1 = plVar4->nodetype;
  if ((op == LYD_DIFF_OP_REPLACE && uVar1 == 4) &&
     ((orig_default == (char *)0x0 || (orig_value == (char *)0x0)))) {
    __assert_fail("(node->schema->nodetype != LYS_LEAF) || (op != LYD_DIFF_OP_REPLACE) || (orig_default && orig_value)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x144,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  if (((uVar1 == 0x10) && (op == LYD_DIFF_OP_CREATE)) && ((plVar4->flags & 0x40) != 0)) {
    if ((plVar4->flags >> 9 & 1) == 0) {
      if (key == (char *)0x0) {
LAB_001164a6:
        __assert_fail("(node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || key"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x148,
                      "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                     );
      }
    }
    else if (key == (char *)0x0 && position == (char *)0x0) goto LAB_001164a6;
  }
  if (((uVar1 == 8) && (op == LYD_DIFF_OP_CREATE)) &&
     (((plVar4->flags & 0x40) != 0 &&
      ((value == (char *)0x0 && (position == (char *)0x0 || (plVar4->flags & 1) != 0)))))) {
    __assert_fail("(node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || value"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x14a,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  if (((((uVar1 == 0x10) && (op == LYD_DIFF_OP_REPLACE)) && ((plVar4->flags & 0x40) != 0)) &&
      (((plVar4->flags >> 9 & 1) == 0 || (position == (char *)0x0 || orig_position == (char *)0x0)))
      ) && ((key == (char *)0x0 || (orig_key == (char *)0x0)))) {
    __assert_fail("(node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (key && orig_key)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x14e,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  local_50 = orig_default;
  if (((uVar1 == 8) && (op == LYD_DIFF_OP_REPLACE)) &&
     ((((plVar4->flags & 0x40) != 0 &&
       (((orig_position == (char *)0x0 || (position == (char *)0x0)) || ((plVar4->flags & 1) != 0)))
       ) && ((orig_value == (char *)0x0 || (value == (char *)0x0)))))) {
    __assert_fail("(node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (value && orig_value)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x151,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  plVar12 = *diff;
  plVar14 = (lyd_node_inner *)0x0;
  local_7c = op;
  local_68 = value;
  local_58 = orig_value;
  while( true ) {
    plVar16 = node->parent;
    plVar17 = (lyd_node_inner *)node;
    while ((plVar16 != (lyd_node_inner *)0x0 &&
           ((plVar14 == (lyd_node_inner *)0x0 ||
            ((plVar16->field_0).node.schema != (plVar14->field_0).node.schema))))) {
      if (plVar17 != (lyd_node_inner *)0x0) {
        plVar17 = plVar16;
      }
      plVar16 = *(lyd_node_inner **)((long)&plVar17->field_0 + 0x10);
    }
    plVar4 = (plVar17->field_0).node.schema;
    if (plVar4 != (lysc_node *)0x0) break;
LAB_0011659b:
    LVar8 = lyd_find_sibling_first(plVar12,(lyd_node *)plVar17,(lyd_node **)&local_78);
    plVar16 = local_78;
    if ((LVar8 != LY_SUCCESS) ||
       (plVar12 = lyd_child_no_keys((lyd_node *)local_78), plVar14 = plVar16,
       plVar17 == (lyd_node_inner *)node)) goto LAB_001165ca;
  }
  if (plVar4->nodetype == 8) {
    if ((plVar4->flags & 1) != 0) goto LAB_0011659b;
  }
  else if ((plVar4->nodetype != 0x10) || ((plVar4->flags & 0x200) == 0)) goto LAB_0011659b;
  local_78 = (lyd_node_inner *)0x0;
LAB_001165ca:
  local_60 = key;
  if ((plVar17 == (lyd_node_inner *)node) && (local_78 != (lyd_node_inner *)0x0)) {
    LVar8 = lyd_diff_get_op((lyd_node *)plVar14,&local_6c);
    if ((LVar8 != LY_SUCCESS) || (local_6c != LYD_DIFF_OP_NONE)) {
      __assert_fail("!lyd_diff_get_op(diff_parent, &cur_op) && (cur_op == LYD_DIFF_OP_NONE)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x170,
                    "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                   );
    }
    plVar4 = (plVar14->field_0).node.schema;
    if (((plVar4 != (lysc_node *)0x0) && ((plVar4->nodetype & 0x18) != 0)) &&
       (plVar16 = plVar14, (plVar4->flags & 0x40) != 0)) {
      do {
        plVar17 = plVar16;
        plVar16 = (lyd_node_inner *)(plVar17->field_0).node.next;
        if (plVar16 == (lyd_node_inner *)0x0) break;
      } while ((plVar16->field_0).node.schema == (plVar17->field_0).node.schema);
      if (plVar17 != plVar14) {
        LVar8 = lyd_insert_after((lyd_node *)plVar17,(lyd_node *)plVar14);
        node = (lyd_node *)(ulong)LVar8;
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
      }
    }
    lyd_diff_del_meta((lyd_node *)plVar14,"operation");
    plVar12 = lyd_child_no_keys((lyd_node *)plVar14);
    local_90 = plVar14;
    if (plVar12 != (lyd_node *)0x0) {
      do {
        lyd_diff_find_meta(plVar12,"operation",&local_48,(lyd_attr **)0x0);
        if (local_48 == (lyd_meta *)0x0) {
          LVar8 = lyd_new_meta((ly_ctx *)0x0,plVar12,(lys_module *)0x0,"yang:operation","none",2,
                               (lyd_meta **)0x0);
          node = (lyd_node *)((ulong)node & 0xffffffff);
          if (LVar8 != LY_SUCCESS) {
            node = (lyd_node *)(ulong)LVar8;
          }
          if (LVar8 != LY_SUCCESS) {
            return (LY_ERR)node;
          }
        }
        plVar12 = plVar12->next;
      } while (plVar12 != (lyd_node *)0x0);
    }
    goto LAB_0011671c;
  }
  if ((local_7c != LYD_DIFF_OP_REPLACE) ||
     (((plVar4 = node->schema, plVar4 == (lysc_node *)0x0 || ((plVar4->nodetype & 0x18) == 0)) ||
      (uVar9 = 0x4e, (plVar4->flags & 0x42) != 0x40)))) {
    uVar9 = 0x4f;
  }
  if (plVar14 == (lyd_node_inner *)0x0) {
    LVar8 = lyd_dup_single(node,(lyd_node_inner *)0x0,uVar9,(lyd_node **)&local_90);
  }
  else {
    plVar4 = (plVar14->field_0).node.schema;
    if (plVar4 == (lysc_node *)0x0) {
      plVar15 = (lys_module *)&plVar14[1].field_0.node.priv;
    }
    else {
      plVar15 = plVar4->module;
    }
    LVar8 = lyd_dup_single_to_ctx(node,plVar15->ctx,plVar14,uVar9,(lyd_node **)&local_90);
  }
  node = (lyd_node *)(ulong)LVar8;
  if (LVar8 != LY_SUCCESS) {
    return LVar8;
  }
  if (plVar14 == (lyd_node_inner *)0x0) {
    if (local_90 == (lyd_node_inner *)0x0) {
      plVar14 = (lyd_node_inner *)0x0;
    }
    else {
      plVar14 = (local_90->field_0).node.parent;
    }
    do {
      plVar16 = plVar14;
      if (plVar16 == (lyd_node_inner *)0x0) {
        plVar16 = (lyd_node_inner *)0x0;
        break;
      }
      plVar14 = (plVar16->field_0).node.parent;
    } while (plVar14 != (lyd_node_inner *)0x0);
  }
  else {
    plVar14 = (local_90->field_0).node.parent;
    plVar16 = local_90;
    if (plVar14 != (lyd_node_inner *)0x0) {
      do {
        if ((plVar14->field_0).node.schema != (plVar17->field_0).node.schema) break;
        if (plVar16 != (lyd_node_inner *)0x0) {
          plVar16 = plVar14;
        }
        plVar14 = (plVar16->field_0).node.parent;
      } while (plVar14 != (lyd_node_inner *)0x0);
    }
  }
  if (plVar16 == (lyd_node_inner *)0x0) {
    plVar12 = *diff;
    plVar14 = local_90;
LAB_00116ab4:
    lyd_diff_insert_sibling(plVar12,(lyd_node *)plVar14,diff);
  }
  else if ((plVar16->field_0).node.parent == (lyd_node_inner *)0x0) {
    plVar12 = *diff;
    plVar14 = plVar16;
    goto LAB_00116ab4;
  }
  if ((plVar16 != (lyd_node_inner *)0x0) && (plVar16 != local_90)) {
    LVar8 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)plVar16,(lys_module *)0x0,"yang:operation","none"
                         ,2,(lyd_meta **)0x0);
    if (LVar8 != LY_SUCCESS) {
      node = (lyd_node *)(ulong)LVar8;
    }
    if (LVar8 != LY_SUCCESS) {
      return (LY_ERR)node;
    }
  }
LAB_0011671c:
  lVar7 = local_7c;
  plVar14 = local_90;
  pcVar13 = lyd_diff_op2str(local_7c);
  LVar8 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)plVar14,(lys_module *)0x0,"yang:operation",pcVar13,
                       2,(lyd_meta **)0x0);
  uVar18 = (ulong)node & 0xffffffff;
  if (LVar8 != LY_SUCCESS) {
    uVar18 = (ulong)LVar8;
  }
  LVar11 = (LY_ERR)uVar18;
  if (LVar8 == LY_SUCCESS) {
    if (lVar7 == LYD_DIFF_OP_CREATE) {
      bVar6 = true;
      plVar14 = local_90;
      while (plVar16 = plVar14, plVar16 != (lyd_node_inner *)0x0) {
        if (((plVar16 != local_90) &&
            (plVar4 = (plVar16->field_0).node.schema, plVar4 != (lysc_node *)0x0)) &&
           (((plVar4->nodetype & 0x18) != 0 && ((plVar4->flags & 0x40) != 0)))) {
          local_38 = 0;
          local_40 = 0;
          local_88 = (lyd_node *)0x0;
          uVar2 = plVar4->nodetype;
          if (((uVar2 & 0x18) == 0) || (uVar3 = plVar4->flags, (uVar3 & 0x40) == 0)) {
            __assert_fail("lysc_is_userordered(node->schema)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                          ,0x7c,"LY_ERR lyd_diff_add_create_nested_userord(struct lyd_node *)");
          }
          if (((uVar2 == 0x10 & (byte)(uVar3 >> 9) & 1) == 0) &&
             ((uVar2 != 8 || ((uVar3 & 1) != 0)))) {
            node_00 = (plVar16->field_0).node.prev;
            if (uVar2 == 0x10) {
              pcVar13 = "yang:key";
              plVar12 = (lyd_node *)0x1da9d3;
              if (node_00->next != (lyd_node *)0x0) {
                pcVar13 = "yang:key";
                plVar12 = (lyd_node *)0x1da9d3;
                if (node_00->schema == plVar4) {
                  LVar8 = lyd_path_list_predicate
                                    (node_00,(char **)&local_88,&local_38,&local_40,'\0');
                  if (LVar8 != LY_SUCCESS) goto LAB_0011685b;
                  pcVar13 = "yang:key";
                  plVar12 = local_88;
                }
              }
            }
            else {
              pcVar13 = "yang:value";
              plVar12 = (lyd_node *)0x1da9d3;
              if (node_00->next != (lyd_node *)0x0) {
                plVar5 = node_00->schema;
                pcVar13 = "yang:value";
                plVar12 = (lyd_node *)0x1da9d3;
                if (plVar5 == plVar4) {
                  if (node_00 == (lyd_node *)0x0) {
LAB_001169df:
                    pcVar13 = "yang:value";
                    plVar12 = (lyd_node *)0x0;
                  }
                  else {
                    if (plVar5 == (lysc_node *)0x0) {
                      plVar12 = node_00[1].prev;
                    }
                    else {
                      if ((plVar5->nodetype & 0xc) == 0) goto LAB_001169df;
                      plVar12 = *(lyd_node **)(node_00 + 1);
                      pcVar13 = "yang:value";
                      if (plVar12 != (lyd_node *)0x0) goto LAB_0011683f;
                      plVar12 = (lyd_node *)
                                lyd_value_get_canonical
                                          (plVar5->module->ctx,(lyd_value *)(node_00 + 1));
                    }
                    pcVar13 = "yang:value";
                  }
                }
              }
            }
LAB_0011683f:
            LVar8 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)plVar16,(lys_module *)0x0,pcVar13,
                                 (char *)plVar12,2,(lyd_meta **)0x0);
          }
          else {
            uVar9 = lyd_list_pos((lyd_node *)plVar16);
            pcVar13 = "yang:position";
            plVar12 = (lyd_node *)0x1da9d3;
            if (uVar9 < 2) goto LAB_0011683f;
            iVar10 = asprintf((char **)&local_88,"%u",(ulong)(uVar9 - 1));
            if (iVar10 != -1) {
              pcVar13 = "yang:position";
              plVar12 = local_88;
              goto LAB_0011683f;
            }
            plVar4 = (plVar16->field_0).node.schema;
            if (plVar4 == (lysc_node *)0x0) {
              plVar15 = (lys_module *)&plVar16[1].field_0.node.priv;
            }
            else {
              plVar15 = plVar4->module;
            }
            LVar8 = LY_EMEM;
            ly_log(plVar15->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyd_diff_add_create_nested_userord");
          }
LAB_0011685b:
          free(local_88);
          if (LVar8 != LY_SUCCESS) {
            uVar18 = (ulong)LVar8;
          }
          LVar11 = (LY_ERR)uVar18;
          if (LVar8 != LY_SUCCESS) {
            bVar6 = false;
            break;
          }
        }
        LVar11 = (LY_ERR)uVar18;
        plVar4 = (plVar16->field_0).node.schema;
        if ((plVar4 == (lysc_node *)0x0) || ((plVar4->nodetype & 0x711) != 0)) {
          plVar14 = (lyd_node_inner *)plVar16->child;
        }
        else {
          plVar14 = (lyd_node_inner *)0x0;
        }
        if (plVar14 == (lyd_node_inner *)0x0) {
          if (plVar16 == local_90) break;
          plVar14 = (lyd_node_inner *)(plVar16->field_0).node.next;
        }
        if (plVar14 == (lyd_node_inner *)0x0) {
          for (plVar16 = (plVar16->field_0).node.parent;
              ((plVar16->field_0).node.parent != (local_90->field_0).node.parent &&
              (plVar14 = (lyd_node_inner *)(plVar16->field_0).node.next,
              plVar14 == (lyd_node_inner *)0x0)); plVar16 = (plVar16->field_0).node.parent) {
          }
        }
      }
      if (!bVar6) {
        return LVar11;
      }
    }
    if (((((local_50 == (char *)0x0) ||
          (LVar11 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)local_90,(lys_module *)0x0,
                                 "yang:orig-default",local_50,2,(lyd_meta **)0x0),
          LVar11 == LY_SUCCESS)) &&
         ((local_58 == (char *)0x0 ||
          (LVar11 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)local_90,(lys_module *)0x0,
                                 "yang:orig-value",local_58,2,(lyd_meta **)0x0),
          LVar11 == LY_SUCCESS)))) &&
        ((local_60 == (char *)0x0 ||
         (LVar11 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)local_90,(lys_module *)0x0,"yang:key",
                                local_60,2,(lyd_meta **)0x0), LVar11 == LY_SUCCESS)))) &&
       (((local_68 == (char *)0x0 ||
         (LVar11 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)local_90,(lys_module *)0x0,"yang:value",
                                local_68,2,(lyd_meta **)0x0), LVar11 == LY_SUCCESS)) &&
        ((((position == (char *)0x0 ||
           (LVar11 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)local_90,(lys_module *)0x0,
                                  "yang:position",position,2,(lyd_meta **)0x0), LVar11 == LY_SUCCESS
           )) && ((orig_key == (char *)0x0 ||
                  (LVar11 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)local_90,(lys_module *)0x0,
                                         "yang:orig-key",orig_key,2,(lyd_meta **)0x0),
                  LVar11 == LY_SUCCESS)))) &&
         ((orig_position == (char *)0x0 ||
          (LVar11 = lyd_new_meta((ly_ctx *)0x0,(lyd_node *)local_90,(lys_module *)0x0,
                                 "yang:orig-position",orig_position,2,(lyd_meta **)0x0),
          LVar11 == LY_SUCCESS)))))))) {
      LVar11 = LY_SUCCESS;
    }
  }
  return LVar11;
}

Assistant:

LY_ERR
lyd_diff_add(const struct lyd_node *node, enum lyd_diff_op op, const char *orig_default, const char *orig_value,
        const char *key, const char *value, const char *position, const char *orig_key, const char *orig_position,
        struct lyd_node **diff)
{
    struct lyd_node *dup, *siblings, *match = NULL, *diff_parent = NULL, *elem;
    const struct lyd_node *parent = NULL;
    enum lyd_diff_op cur_op;
    struct lyd_meta *meta;
    uint32_t diff_opts;

    assert(diff);

    /* replace leaf always needs orig-default and orig-value */
    assert((node->schema->nodetype != LYS_LEAF) || (op != LYD_DIFF_OP_REPLACE) || (orig_default && orig_value));

    /* create on userord needs key/value */
    assert((node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) ||
            (lysc_is_dup_inst_list(node->schema) && position) || key);
    assert((node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) ||
            (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || value);

    /* move on userord needs both key and orig-key/value and orig-value */
    assert((node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) ||
            (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (key && orig_key));
    assert((node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) ||
            (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) ||
            (value && orig_value));

    /* find the first existing parent */
    siblings = *diff;
    do {
        /* find next node parent */
        parent = node;
        while (parent->parent && (!diff_parent || (parent->parent->schema != diff_parent->schema))) {
            parent = lyd_parent(parent);
        }

        if (lysc_is_dup_inst_list(parent->schema)) {
            /* assume it never exists, we are not able to distinguish whether it does or not */
            match = NULL;
            break;
        }

        /* check whether it exists in the diff */
        if (lyd_find_sibling_first(siblings, parent, &match)) {
            break;
        }

        /* another parent found */
        diff_parent = match;

        /* move down in the diff */
        siblings = lyd_child_no_keys(match);
    } while (parent != node);

    if (match && (parent == node)) {
        /* special case when there is already an operation on our descendant */
        assert(!lyd_diff_get_op(diff_parent, &cur_op) && (cur_op == LYD_DIFF_OP_NONE));
        (void)cur_op;

        /* move it to the end where it is expected (matters for user-ordered lists) */
        if (lysc_is_userordered(diff_parent->schema)) {
            for (elem = diff_parent; elem->next && (elem->next->schema == elem->schema); elem = elem->next) {}
            if (elem != diff_parent) {
                LY_CHECK_RET(lyd_insert_after(elem, diff_parent));
            }
        }

        /* will be replaced by the new operation but keep the current op for descendants */
        lyd_diff_del_meta(diff_parent, "operation");
        LY_LIST_FOR(lyd_child_no_keys(diff_parent), elem) {
            lyd_diff_find_meta(elem, "operation", &meta, NULL);
            if (meta) {
                /* explicit operation, fine */
                continue;
            }

            /* set the none operation */
            LY_CHECK_RET(lyd_new_meta(NULL, elem, NULL, "yang:operation", "none", LYD_NEW_VAL_STORE_ONLY, NULL));
        }

        dup = diff_parent;
    } else {
        diff_opts = LYD_DUP_NO_META | LYD_DUP_WITH_PARENTS | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS;
        if ((op != LYD_DIFF_OP_REPLACE) || !lysc_is_userordered(node->schema) || (node->schema->flags & LYS_CONFIG_R)) {
            /* move applies only to the user-ordered list, no descendants */
            diff_opts |= LYD_DUP_RECURSIVE;
        }

        /* duplicate the subtree (and connect to the diff if possible) */
        if (diff_parent) {
            LY_CHECK_RET(lyd_dup_single_to_ctx(node, LYD_CTX(diff_parent), (struct lyd_node_inner *)diff_parent,
                    diff_opts, &dup));
        } else {
            LY_CHECK_RET(lyd_dup_single(node, NULL, diff_opts, &dup));
        }

        /* find the first duplicated parent */
        if (!diff_parent) {
            diff_parent = lyd_parent(dup);
            while (diff_parent && diff_parent->parent) {
                diff_parent = lyd_parent(diff_parent);
            }
        } else {
            diff_parent = dup;
            while (diff_parent->parent && (diff_parent->parent->schema == parent->schema)) {
                diff_parent = lyd_parent(diff_parent);
            }
        }

        /* no parent existed, must be manually connected */
        if (!diff_parent) {
            /* there actually was no parent to duplicate */
            lyd_diff_insert_sibling(*diff, dup, diff);
        } else if (!diff_parent->parent) {
            lyd_diff_insert_sibling(*diff, diff_parent, diff);
        }

        /* add parent operation, if any */
        if (diff_parent && (diff_parent != dup)) {
            LY_CHECK_RET(lyd_new_meta(NULL, diff_parent, NULL, "yang:operation", "none", LYD_NEW_VAL_STORE_ONLY, NULL));
        }
    }

    /* add subtree operation */
    LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:operation", lyd_diff_op2str(op), LYD_NEW_VAL_STORE_ONLY, NULL));

    if (op == LYD_DIFF_OP_CREATE) {
        /* all nested user-ordered (leaf-)lists need special metadata for create op */
        LYD_TREE_DFS_BEGIN(dup, elem) {
            if ((elem != dup) && lysc_is_userordered(elem->schema)) {
                LY_CHECK_RET(lyd_diff_add_create_nested_userord(elem));
            }
            LYD_TREE_DFS_END(dup, elem);
        }
    }

    /* orig-default */
    if (orig_default) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-default", orig_default, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-value */
    if (orig_value) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-value", orig_value, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* key */
    if (key) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:key", key, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* value */
    if (value) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:value", value, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* position */
    if (position) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:position", position, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-key */
    if (orig_key) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-key", orig_key, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-position */
    if (orig_position) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-position", orig_position, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    return LY_SUCCESS;
}